

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

int trex_list(TRex *exp)

{
  int iVar1;
  int iVar2;
  
  iVar1 = -1;
  if (*exp->_p == '^') {
    exp->_p = exp->_p + 1;
    iVar1 = trex_newnode(exp,0x10b);
  }
  iVar2 = trex_element(exp);
  if (iVar1 != -1) {
    exp->_nodes[iVar1].next = iVar2;
    iVar2 = iVar1;
  }
  iVar1 = iVar2;
  if (*exp->_p == '|') {
    exp->_p = exp->_p + 1;
    iVar1 = trex_newnode(exp,0x101);
    exp->_nodes[iVar1].left = iVar2;
    iVar2 = trex_list(exp);
    exp->_nodes[iVar1].right = iVar2;
  }
  return iVar1;
}

Assistant:

static int trex_list(TRex* exp) {
    int ret = -1, e;
    if (*exp->_p == TREX_SYMBOL_BEGINNING_OF_STRING) {
        exp->_p++;
        ret = trex_newnode(exp, OP_BOL);
    }
    e = trex_element(exp);
    if (ret != -1) {
        exp->_nodes[ret].next = e;
    } else
        ret = e;

    if (*exp->_p == TREX_SYMBOL_BRANCH) {
        int temp, tright;
        exp->_p++;
        temp = trex_newnode(exp, OP_OR);
        exp->_nodes[temp].left = ret;
        tright = trex_list(exp);
        exp->_nodes[temp].right = tright;
        ret = temp;
    }
    return ret;
}